

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_agree_mac(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *mac,size_t mac_len
                 )

{
  LIBSSH2_MAC_METHOD *pLVar1;
  char *pcVar2;
  uchar *puVar3;
  _LIBSSH2_MAC_METHOD *p_Var4;
  size_t needle_len;
  bool bVar5;
  uchar *local_78;
  size_t local_70;
  LIBSSH2_MAC_METHOD *method;
  size_t method_len;
  uchar *p;
  uchar *s;
  LIBSSH2_MAC_METHOD *override;
  LIBSSH2_MAC_METHOD **macp;
  size_t mac_len_local;
  uchar *mac_local;
  libssh2_endpoint_data *endpoint_local;
  LIBSSH2_SESSION *session_local;
  
  override = (LIBSSH2_MAC_METHOD *)_libssh2_mac_methods();
  pLVar1 = _libssh2_mac_override(endpoint->crypt);
  if (pLVar1 == (LIBSSH2_MAC_METHOD *)0x0) {
    if (endpoint->mac_prefs == (char *)0x0) {
      while( true ) {
        bVar5 = false;
        if (override->name != (char *)0x0) {
          bVar5 = *(long *)override->name != 0;
        }
        if (!bVar5) {
          return -1;
        }
        puVar3 = *(uchar **)override->name;
        needle_len = strlen(*(char **)override->name);
        puVar3 = _libssh2_kex_agree_instr(mac,mac_len,puVar3,needle_len);
        if (puVar3 != (uchar *)0x0) break;
        override = (LIBSSH2_MAC_METHOD *)&override->mac_len;
      }
      endpoint->mac = (_LIBSSH2_MAC_METHOD *)override->name;
      session_local._4_4_ = 0;
    }
    else {
      p = (uchar *)endpoint->mac_prefs;
      while( true ) {
        bVar5 = false;
        if (p != (uchar *)0x0) {
          bVar5 = *p != '\0';
        }
        if (!bVar5) {
          return -1;
        }
        pcVar2 = strchr((char *)p,0x2c);
        if (pcVar2 == (char *)0x0) {
          local_70 = strlen((char *)p);
        }
        else {
          local_70 = (long)pcVar2 - (long)p;
        }
        puVar3 = _libssh2_kex_agree_instr(mac,mac_len,p,local_70);
        if (puVar3 != (uchar *)0x0) break;
        if (pcVar2 == (char *)0x0) {
          local_78 = (uchar *)0x0;
        }
        else {
          local_78 = (uchar *)(pcVar2 + 1);
        }
        p = local_78;
      }
      p_Var4 = (_LIBSSH2_MAC_METHOD *)
               kex_get_method_by_name((char *)p,local_70,(LIBSSH2_COMMON_METHOD **)override);
      if (p_Var4 == (_LIBSSH2_MAC_METHOD *)0x0) {
        session_local._4_4_ = -1;
      }
      else {
        endpoint->mac = p_Var4;
        session_local._4_4_ = 0;
      }
    }
  }
  else {
    endpoint->mac = pLVar1;
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

static int kex_agree_mac(LIBSSH2_SESSION * session,
                         libssh2_endpoint_data * endpoint, unsigned char *mac,
                         size_t mac_len)
{
    const LIBSSH2_MAC_METHOD **macp = _libssh2_mac_methods();
    const LIBSSH2_MAC_METHOD *override;
    unsigned char *s;
    (void)session;

    override = _libssh2_mac_override(endpoint->crypt);
    if(override) {
        /* This crypto method has its own hmac method built-in, so a separate
         * negotiation (and use) of a separate hmac method is unnecessary */
        endpoint->mac = override;
        return 0;
    }

    if(endpoint->mac_prefs) {
        s = (unsigned char *) endpoint->mac_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if(_libssh2_kex_agree_instr(mac, mac_len, s, method_len)) {
                const LIBSSH2_MAC_METHOD *method = (const LIBSSH2_MAC_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           macp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->mac = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(*macp && (*macp)->name) {
        s = _libssh2_kex_agree_instr(mac, mac_len,
                                     (unsigned char *) (*macp)->name,
                                     strlen((*macp)->name));
        if(s) {
            endpoint->mac = *macp;
            return 0;
        }
        macp++;
    }

    return -1;
}